

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_checkheaders(connectdata *conn,char *thisheader)

{
  int iVar1;
  size_t max;
  SessionHandle *data;
  size_t thislen;
  curl_slist *head;
  char *thisheader_local;
  connectdata *conn_local;
  
  max = strlen(thisheader);
  thislen = (size_t)(conn->data->set).headers;
  while( true ) {
    if (thislen == 0) {
      return (char *)0x0;
    }
    iVar1 = Curl_raw_nequal(*(char **)thislen,thisheader,max);
    if (iVar1 != 0) break;
    thislen = *(size_t *)(thislen + 8);
  }
  return *(char **)thislen;
}

Assistant:

char *Curl_checkheaders(const struct connectdata *conn,
                        const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct SessionHandle *data = conn->data;

  for(head = data->set.headers;head; head=head->next) {
    if(Curl_raw_nequal(head->data, thisheader, thislen))
      return head->data;
  }
  return NULL;
}